

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O0

_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *
duckdb::GetDatePartFunction<duckdb::DatePart::WeekOperator>(void)

{
  _func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *in_RDI;
  function_statistics_t in_stack_000006c8;
  function_statistics_t in_stack_000006d0;
  scalar_function_t *in_stack_000006d8;
  scalar_function_t *in_stack_000006e0;
  scalar_function_t *in_stack_000006e8;
  _func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *__f;
  function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *this;
  function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> local_28;
  
  this = &local_28;
  __f = in_RDI;
  std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>(this,in_RDI);
  std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>(this,__f);
  std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>(this,__f);
  GetGenericDatePartFunction<(duckdb::unique_ptr<duckdb::FunctionLocalState,std::default_delete<duckdb::FunctionLocalState>,true>(*)(duckdb::ExpressionState&,duckdb::BoundFunctionExpression_const&,duckdb::FunctionData*))0>
            (in_stack_000006e8,in_stack_000006e0,in_stack_000006d8,in_stack_000006d0,
             in_stack_000006c8);
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::~function
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             0xbede24);
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::~function
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             0xbede2e);
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::~function
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             0xbede3b);
  return in_RDI;
}

Assistant:

static ScalarFunctionSet GetDatePartFunction() {
	return GetGenericDatePartFunction(
	    DatePart::UnaryFunction<date_t, int64_t, OP>, DatePart::UnaryFunction<timestamp_t, int64_t, OP>,
	    ScalarFunction::UnaryFunction<interval_t, int64_t, OP>, OP::template PropagateStatistics<date_t>,
	    OP::template PropagateStatistics<timestamp_t>);
}